

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_DrawSplash2(int count,DVector3 *pos,DAngle *angle,int updown,int kind)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  uint32 local_8c;
  double local_80;
  TAngle<double> local_68;
  TAngle<double> local_60;
  TAngle<double> local_58;
  DAngle an;
  particle_t *p;
  double zspread;
  double zvel;
  uint32 local_30;
  int zadd;
  int color2;
  int color1;
  int kind_local;
  int updown_local;
  DAngle *angle_local;
  DVector3 *pos_local;
  int count_local;
  
  if (kind == 0) {
    zadd = blood1;
    local_30 = blood2;
  }
  else if (kind == 1) {
    zadd = grey3;
    local_30 = grey5;
  }
  else if (kind == 2) {
    zadd = grey3;
    local_30 = grey1;
  }
  else {
    zadd = ParticleColor(kind);
    local_30 = ParticleColor((kind >> 0x10 & 0xffU) / 3,(kind >> 8 & 0xffU) / 3,(kind & 0xffU) / 3);
  }
  local_80 = -0.091552734375;
  if (updown == 0) {
    local_80 = 0.091552734375;
  }
  iVar1 = 0;
  pos_local._4_4_ = count;
  if (updown == 2) {
    iVar1 = -0x80;
  }
  while( true ) {
    if (pos_local._4_4_ == 0) {
      return;
    }
    an.Degrees = (double)NewParticle();
    TAngle<double>::TAngle(&local_58);
    if (an.Degrees == 0.0) break;
    *(undefined1 *)((long)an.Degrees + 0x48) = 0xc;
    *(undefined1 *)((long)an.Degrees + 0x61) = 0x15;
    *(undefined1 *)((long)an.Degrees + 0x49) = 0xff;
    *(undefined8 *)((long)an.Degrees + 0x50) = 0x4010000000000000;
    uVar2 = FRandom::operator()(&M_Random);
    if ((uVar2 & 0x80) == 0) {
      local_8c = local_30;
    }
    else {
      local_8c = zadd;
    }
    *(uint32 *)((long)an.Degrees + 100) = local_8c;
    iVar3 = FRandom::operator()(&M_Random);
    *(double *)((long)an.Degrees + 0x28) = (double)iVar3 * -0.001953125;
    *(undefined8 *)((long)an.Degrees + 0x40) = 0xbfa745d1745d1746;
    if (kind != 0) {
      iVar3 = FRandom::operator()(&M_Random);
      TAngle<double>::operator+(&local_60,(double)(iVar3 + -0x80) * 0.703125);
      TAngle<double>::operator=(&local_58,&local_60);
      iVar3 = FRandom::operator()(&M_Random);
      dVar4 = TAngle<double>::Cos(&local_58);
      *(double *)((long)an.Degrees + 0x18) = ((double)iVar3 * dVar4) / 2048.0;
      iVar3 = FRandom::operator()(&M_Random);
      dVar4 = TAngle<double>::Sin(&local_58);
      *(double *)((long)an.Degrees + 0x20) = ((double)iVar3 * dVar4) / 2048.0;
      *(double *)((long)an.Degrees + 0x30) = *(double *)((long)an.Degrees + 0x18) / 16.0;
      *(double *)((long)an.Degrees + 0x38) = *(double *)((long)an.Degrees + 0x20) / 16.0;
    }
    iVar3 = FRandom::operator()(&M_Random);
    TAngle<double>::operator+(&local_68,(double)(iVar3 + -0x80) * 0.3515625);
    TAngle<double>::operator=(&local_58,&local_68);
    dVar4 = pos->X;
    uVar2 = FRandom::operator()(&M_Random);
    dVar5 = TAngle<double>::Cos(&local_58);
    *(double *)an.Degrees = dVar4 + (double)(int)((uVar2 & 0x1f) - 0xf) * dVar5;
    dVar4 = pos->Y;
    uVar2 = FRandom::operator()(&M_Random);
    dVar5 = TAngle<double>::Sin(&local_58);
    *(double *)((long)an.Degrees + 8) = dVar4 + (double)(int)((uVar2 & 0x1f) - 0xf) * dVar5;
    dVar4 = pos->Z;
    iVar3 = FRandom::operator()(&M_Random);
    *(double *)((long)an.Degrees + 0x10) = dVar4 + (double)(iVar3 + iVar1 + -0x80) * local_80;
    pos_local._4_4_ = pos_local._4_4_ + -1;
  }
  return;
}

Assistant:

void P_DrawSplash2 (int count, const DVector3 &pos, DAngle angle, int updown, int kind)
{
	int color1, color2, zadd;
	double zvel, zspread;

	switch (kind)
	{
	case 0:		// Blood
		color1 = blood1;
		color2 = blood2;
		break;
	case 1:		// Gunshot
		color1 = grey3;
		color2 = grey5;
		break;
	case 2:		// Smoke
		color1 = grey3;
		color2 = grey1;
		break;
	default:	// colorized blood
		color1 = ParticleColor(kind);
		color2 = ParticleColor(RPART(kind)/3, GPART(kind)/3, BPART(kind)/3);
		break;
	}

	zvel = -1./512.;
	zspread = updown ? -6000 / 65536. : 6000 / 65536.;
	zadd = (updown == 2) ? -128 : 0;

	for (; count; count--)
	{
		particle_t *p = NewParticle ();
		DAngle an;

		if (!p)
			break;

		p->ttl = 12;
		p->fade = FADEFROMTTL(12);
		p->trans = 255;
		p->size = 4;
		p->color = M_Random() & 0x80 ? color1 : color2;
		p->Vel.Z = M_Random() * zvel;
		p->Acc.Z = -1 / 22.;
		if (kind) 
		{
			an = angle + ((M_Random() - 128) * (180 / 256.));
			p->Vel.X = M_Random() * an.Cos() / 2048.;
			p->Vel.Y = M_Random() * an.Sin() / 2048.;
			p->Acc.X = p->Vel.X / 16.;
			p->Acc.Y = p->Vel.Y / 16.;
		}
		an = angle + ((M_Random() - 128) * (90 / 256.));
		p->Pos.X = pos.X + ((M_Random() & 31) - 15) * an.Cos();
		p->Pos.Y = pos.Y + ((M_Random() & 31) - 15) * an.Sin();
		p->Pos.Z = pos.Z + (M_Random() + zadd - 128) * zspread;
	}
}